

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_list_has_keys(lyd_node *list)

{
  lys_node *plVar1;
  lyd_node *plVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  lyd_node **pplVar6;
  
  plVar1 = list->schema;
  if (plVar1->nodetype != LYS_LIST) {
    __assert_fail("list->schema->nodetype == LYS_LIST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x56,"int lyd_list_has_keys(struct lyd_node *)");
  }
  uVar4 = (ulong)plVar1->padding[2];
  if (uVar4 == 0) {
    uVar3 = 1;
  }
  else {
    pplVar6 = &list->child;
    for (uVar5 = 0; (plVar2 = *pplVar6, plVar2 != (lyd_node *)0x0 && (uVar5 < uVar4));
        uVar5 = uVar5 + 1) {
      if (plVar2->schema != *(lys_node **)(*(long *)&plVar1[1].flags + uVar5 * 8)) {
        return 0;
      }
      pplVar6 = &plVar2->next;
    }
    uVar3 = (uint)(uVar4 <= uVar5);
  }
  return uVar3;
}

Assistant:

int
lyd_list_has_keys(struct lyd_node *list)
{
    struct lyd_node *iter;
    struct lys_node_list *slist;
    int i;

    assert(list->schema->nodetype == LYS_LIST);

    /* even though hash is 0, it may be a valid hash, that is what we are going to check */

    slist = (struct lys_node_list *)list->schema;
    if (!slist->keys_size) {
        /* always has keys */
        return 1;
    }

    i = 0;
    iter = list->child;
    while (iter && (i < slist->keys_size)) {
        if (iter->schema != (struct lys_node *)slist->keys[i]) {
            /* missing key */
            return 0;
        }

        ++i;
        iter = iter->next;
    }
    if (i < slist->keys_size) {
        /* missing key */
        return 0;
    }

    /* all keys found */
    return 1;
}